

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_code_domain.hpp
# Opt level: O2

bool __thiscall
system_error2::status_code_domain::_do_erased_copy
          (status_code_domain *this,status_code<void> *dst,status_code<void> *src,
          payload_info_t dstinfo)

{
  undefined1 auStack_38 [8];
  size_t local_30;
  
  (*this->_vptr_status_code_domain[1])(auStack_38,this);
  if (local_30 <= dstinfo.total_size) {
    memcpy(dst,src,local_30);
  }
  return local_30 <= dstinfo.total_size;
}

Assistant:

virtual bool _do_erased_copy(status_code<void> &dst, const status_code<void> &src, payload_info_t dstinfo) const
  {
    // Note that dst may not have its domain set
    const auto srcinfo = payload_info();
    if(dstinfo.total_size < srcinfo.total_size)
    {
      return false;
    }
    const auto tocopy = (dstinfo.total_size > srcinfo.total_size) ? srcinfo.total_size : dstinfo.total_size;
    memcpy(&dst, &src, tocopy);
    return true;
  }